

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resample_filters.cpp
# Opt level: O0

float crnlib::kaiser_filter(float t)

{
  double dVar1;
  double dVar2;
  float alpha;
  float att;
  float t_local;
  
  alpha = t;
  if (t < 0.0) {
    alpha = -t;
  }
  if (3.0 <= alpha) {
    att = 0.0;
  }
  else {
    dVar1 = log(11.122596799999998);
    dVar1 = exp(dVar1 * 0.4);
    dVar2 = sinc((double)alpha);
    dVar1 = kaiser((double)(float)(dVar1 + 1.5014944),3.0,(double)alpha);
    att = clean(dVar2 * dVar1);
  }
  return att;
}

Assistant:

static float kaiser_filter(float t)
    {
        if (t < 0.0f)
        {
            t = -t;
        }

        if (t < KAISER_SUPPORT)
        {
            // db atten
            const float att = 40.0f;
            const float alpha = (float)(exp(log((double)0.58417 * (att - 20.96)) * 0.4) + 0.07886 * (att - 20.96));
            //const float alpha = KAISER_ALPHA;
            return (float)clean(sinc(t) * kaiser(alpha, KAISER_SUPPORT, t));
        }

        return 0.0f;
    }